

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_integer_primitive_divide
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  if ((arguments[1] & 0xf) == 0 || (*arguments & 0xf) == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (((long)*arguments >> 4) / ((long)arguments[1] >> 4)) * 0x10 + 1;
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_integer_primitive_divide(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    return sysbvm_integer_divide(context, arguments[0], arguments[1]);
}